

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenNum(Lexer *this)

{
  int iVar1;
  Lexer *in_RSI;
  undefined2 local_6a;
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  local_68;
  undefined1 local_5c [36];
  size_t local_38;
  size_t local_30;
  
  if (in_RSI->currentChar == 0x30) {
    nextChar(in_RSI);
    iVar1 = in_RSI->currentChar;
    if (iVar1 == 0x78) {
      nextTokenHexNum(this);
    }
    else if (iVar1 == 0x6f) {
      nextTokenOctNum(this);
    }
    else if (iVar1 == 0x62) {
      nextTokenBinNum(this);
    }
    else if (iVar1 - 0x30U < 10) {
      local_6a = LEX_ERR_ID_NOT_JUST_ANYS;
      local_5c._0_4_ = 7;
      getCurrentCursor((Position *)(local_5c + 4),in_RSI);
      local_38 = in_RSI->currentStartIndex;
      local_5c._28_8_ = local_5c._4_8_;
      local_30 = local_38;
      std::
      make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                ((Level *)&local_68,(LexerErrorCode *)&local_6a,(Position *)local_5c);
      generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                          *)in_RSI);
      std::
      unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
      ::~unique_ptr(&local_68);
    }
    else if (iVar1 == 0x2e) {
      nextTokenFltNum(this,(size_t)in_RSI);
    }
    else {
      nextTokenNumType(this,(uint64_t)in_RSI);
    }
  }
  else {
    nextTokenDecNum(this);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenNum() noexcept {
  if (currentChar == '0') {
    nextChar(); // eat 0
    switch (currentChar) {
    case 'b':
      return nextTokenBinNum();
    case 'o':
      return nextTokenOctNum();
    case 'x':
      return nextTokenHexNum();
    default:
      if (isdigit(currentChar)) {
        return generateError(std::make_unique<LexerError>(LVL_ERROR,
          LexerErrorCode::LEX_ERR_NUM_LEADING_ZERO, Position{getCurrentCursor().line,
            currentStartIndex, currentStartIndex}));
      } else if (currentChar == '.') {
        return nextTokenFltNum(0);
      }

      return nextTokenNumType(0);
    }
  }

  return nextTokenDecNum();
}